

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O2

void __thiscall ipx::Basis::PivotFreeVariablesIntoBasis(Basis *this,double *colweights,Info *info)

{
  ipxint *piVar1;
  uint uVar2;
  pointer piVar3;
  bool bVar4;
  int iVar5;
  Int IVar6;
  ostream *poVar7;
  int iVar8;
  Info *pIVar9;
  string *__return_storage_ptr__;
  ulong uVar10;
  Int ii;
  int local_2ac;
  Int pmax_nonfree;
  Int pmax;
  Info *local_2a0;
  vector<int,_std::allocator<int>_> remaining;
  double delta_obj;
  double *colweights_local;
  double local_270;
  double fmax_nonfree;
  double fmax;
  IndexedVector ftran;
  bool exchanged;
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  anon_class_48_6_c9aeef18 update_max;
  stringstream h_logging_stream;
  undefined4 uStack_1d4;
  undefined1 local_1c8 [376];
  string local_50;
  
  IVar6 = this->model_->num_rows_;
  iVar8 = this->model_->num_cols_;
  colweights_local = colweights;
  IndexedVector::IndexedVector(&ftran,IVar6);
  local_270 = (this->control_->parameters_).super_ipx_parameters.dependency_tol;
  (info->super_ipx_info).errflag = 0;
  (info->super_ipx_info).dependent_cols = 0;
  if (local_270 <= 0.0) {
    local_270 = 0.0;
  }
  remaining.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  remaining.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  remaining.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar5 = 0;
  local_2a0 = info;
  while( true ) {
    _h_logging_stream = iVar5;
    if (iVar8 + IVar6 <= iVar5) break;
    if ((ABS(colweights_local[iVar5]) == INFINITY) &&
       ((this->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar5] < 0)) {
      std::vector<int,_std::allocator<int>_>::push_back
                (&remaining,(value_type_conflict2 *)&h_logging_stream);
      iVar5 = _h_logging_stream;
    }
    iVar5 = iVar5 + 1;
  }
  poVar7 = Control::Debug(this->control_,1);
  pIVar9 = local_2a0;
  Textline<char[35]>((string *)&h_logging_stream,(char (*) [35])"Number of free variables nonbasic:"
                    );
  poVar7 = std::operator<<(poVar7,(string *)&h_logging_stream);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::operator<<(poVar7,'\n');
  std::__cxx11::string::~string((string *)&h_logging_stream);
  Control::ResetPrintInterval(this->control_);
  local_2ac = 0;
LAB_00372b70:
  do {
    if (remaining.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        remaining.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      poVar7 = Control::Debug(this->control_,1);
      Textline<char[48]>((string *)&h_logging_stream,
                         (char (*) [48])"Number of free variables swapped for stability:");
      poVar7 = std::operator<<(poVar7,(string *)&h_logging_stream);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_2ac);
      std::operator<<(poVar7,'\n');
      std::__cxx11::string::~string((string *)&h_logging_stream);
      goto LAB_00373021;
    }
    iVar8 = remaining.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish[-1];
    IVar6 = Control::InterruptCheck(this->control_,-1);
    (pIVar9->super_ipx_info).errflag = IVar6;
    if (IVar6 != 0) goto LAB_00373021;
    SolveForUpdate(this,iVar8,&ftran);
    pmax = -1;
    pmax_nonfree = -1;
    fmax = 0.0;
    fmax_nonfree = 0.0;
    update_max.fmax = &fmax;
    update_max.pmax = &pmax;
    update_max.colweights = &colweights_local;
    update_max.fmax_nonfree = &fmax_nonfree;
    update_max.pmax_nonfree = &pmax_nonfree;
    update_max.this = this;
    bVar4 = IndexedVector::sparse(&ftran);
    piVar3 = ftran.pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (bVar4) {
      uVar2 = ftran.nnz_;
      if (ftran.nnz_ < 1) {
        uVar2 = 0;
      }
      for (uVar10 = 0; uVar2 != uVar10; uVar10 = uVar10 + 1) {
        PivotFreeVariablesIntoBasis::anon_class_48_6_c9aeef18::operator()
                  (&update_max,piVar3[uVar10],ftran.elements_._M_data[piVar3[uVar10]]);
      }
    }
    else {
      uVar2 = (uint)ftran.elements_._M_size;
      if ((int)(uint)ftran.elements_._M_size < 1) {
        uVar2 = 0;
      }
      for (uVar10 = 0; uVar2 != uVar10; uVar10 = uVar10 + 1) {
        PivotFreeVariablesIntoBasis::anon_class_48_6_c9aeef18::operator()
                  (&update_max,(Int)uVar10,ftran.elements_._M_data[uVar10]);
      }
    }
    pIVar9 = local_2a0;
    if ((fmax <= 4.0) || (1.0 <= fmax_nonfree)) {
      if (fmax_nonfree <= local_270) {
        if ((local_2a0->super_ipx_info).cols_inconsistent == 0) {
          local_1c8._8_8_ = &this->model_->c_;
          delta_obj = (this->model_->c_)._M_data[iVar8];
          local_1c8._0_8_ = &delta_obj;
          _h_logging_stream = (pointer)this;
          bVar4 = IndexedVector::sparse(&ftran);
          piVar3 = ftran.pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (bVar4) {
            uVar2 = ftran.nnz_;
            if (ftran.nnz_ < 1) {
              uVar2 = 0;
            }
            for (uVar10 = 0; uVar2 != uVar10; uVar10 = uVar10 + 1) {
              PivotFreeVariablesIntoBasis::anon_class_32_4_8cdf9ef1::operator()
                        ((anon_class_32_4_8cdf9ef1 *)&h_logging_stream,piVar3[uVar10],
                         ftran.elements_._M_data[piVar3[uVar10]]);
            }
          }
          else {
            uVar2 = (uint)ftran.elements_._M_size;
            if ((int)(uint)ftran.elements_._M_size < 1) {
              uVar2 = 0;
            }
            for (uVar10 = 0; uVar2 != uVar10; uVar10 = uVar10 + 1) {
              PivotFreeVariablesIntoBasis::anon_class_32_4_8cdf9ef1::operator()
                        ((anon_class_32_4_8cdf9ef1 *)&h_logging_stream,(Int)uVar10,
                         ftran.elements_._M_data[uVar10]);
            }
          }
          pIVar9 = local_2a0;
          if (local_270 < ABS(delta_obj)) {
            poVar7 = Control::Debug(this->control_,1);
            __return_storage_ptr__ = (string *)&exchanged;
            Textline<char[44]>(__return_storage_ptr__,
                               (char (*) [44])"Unbounded primal ray with objective change:");
            poVar7 = std::operator<<(poVar7,(string *)__return_storage_ptr__);
            sci2_abi_cxx11_(&local_50,(ipx *)__return_storage_ptr__,delta_obj);
            poVar7 = std::operator<<(poVar7,(string *)&local_50);
            std::operator<<(poVar7,'\n');
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&exchanged);
            (pIVar9->super_ipx_info).cols_inconsistent = 1;
          }
        }
        piVar1 = &(pIVar9->super_ipx_info).dependent_cols;
        *piVar1 = *piVar1 + 1;
        remaining.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = remaining.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
LAB_00372f22:
        std::__cxx11::stringstream::stringstream((stringstream *)&h_logging_stream);
        _exchanged = (pointer)&local_218;
        local_220 = 0;
        local_218._M_local_buf[0] = '\0';
        std::__cxx11::stringbuf::str((string *)(local_1c8 + 8));
        std::__cxx11::string::~string((string *)&exchanged);
        poVar7 = std::operator<<((ostream *)local_1c8," ");
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::operator<<(poVar7," free variables remaining\n");
        Control::hIntervalLog(this->control_,&h_logging_stream);
        std::__cxx11::stringstream::~stringstream((stringstream *)&h_logging_stream);
        goto LAB_00372b70;
      }
      IVar6 = ExchangeIfStable(this,(this->basis_).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[pmax_nonfree],iVar8,
                               ftran.elements_._M_data[pmax_nonfree],-1,(bool *)&h_logging_stream);
      (pIVar9->super_ipx_info).errflag = IVar6;
      iVar8 = 1;
      if (IVar6 == 0) {
        iVar8 = 5;
        if (h_logging_stream != (stringstream)0x0) {
          remaining.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = remaining.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + -1;
          piVar1 = &(pIVar9->super_ipx_info).updates_start;
          *piVar1 = *piVar1 + 1;
          goto LAB_00372f22;
        }
      }
    }
    else {
      IVar6 = (this->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[pmax];
      _h_logging_stream = IVar6;
      IVar6 = ExchangeIfStable(this,IVar6,iVar8,ftran.elements_._M_data[pmax],-1,&exchanged);
      pIVar9 = local_2a0;
      (local_2a0->super_ipx_info).errflag = IVar6;
      iVar8 = 1;
      if (IVar6 == 0) {
        iVar8 = 5;
        if (exchanged == true) {
          remaining.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = remaining.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + -1;
          std::vector<int,_std::allocator<int>_>::push_back
                    (&remaining,(value_type_conflict2 *)&h_logging_stream);
          piVar1 = &(pIVar9->super_ipx_info).updates_start;
          *piVar1 = *piVar1 + 1;
          local_2ac = local_2ac + 1;
          goto LAB_00372f22;
        }
      }
    }
    if (iVar8 != 5) {
LAB_00373021:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&remaining.super__Vector_base<int,_std::allocator<int>_>);
      IndexedVector::~IndexedVector(&ftran);
      return;
    }
  } while( true );
}

Assistant:

void Basis::PivotFreeVariablesIntoBasis(const double* colweights, Info* info) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    IndexedVector ftran(m);
    const double dependency_tol = std::max(0.0, control_.dependency_tol());
    info->errflag = 0;
    info->dependent_cols = 0;
    Int stability_pivots = 0;

    // Maintain stack of free nonbasic variables.
    std::vector<Int> remaining;
    for (Int j = 0; j < n+m; j++) {
        if (std::isinf(colweights[j]) && map2basis_[j] < 0)
            remaining.push_back(j);
    }
    control_.Debug() << Textline("Number of free variables nonbasic:")
                  << remaining.size() << '\n';

    control_.ResetPrintInterval();
    while (!remaining.empty()) {
        Int jn = remaining.back();
        assert(std::isinf(colweights[jn]));
        assert(map2basis_[jn] < 0);
        if ((info->errflag = control_.InterruptCheck()) != 0)
            return;

        SolveForUpdate(jn, ftran);
        Int pmax = -1;
        Int pmax_nonfree = -1;
        double fmax = 0.0;
        double fmax_nonfree = 0.0;
        auto update_max = [&](Int p, double f) {
            f = std::abs(f);
            if (f > fmax) {
                fmax = f;
                pmax = p;
            }
            if (!std::isinf(colweights[basis_[p]])) {
                if (f > fmax_nonfree) {
                    fmax_nonfree = f;
                    pmax_nonfree = p;
                }
            }
        };
        for_each_nonzero(ftran, update_max);

        if (fmax > 4.0 && fmax_nonfree < 1.0) {
            Int jb = basis_[pmax];
            assert(std::isinf(colweights[jb]));
            bool exchanged;
            info->errflag = ExchangeIfStable(jb, jn, ftran[pmax], -1,
                                             &exchanged);
            if (info->errflag)
                return;
            if (!exchanged)     // factorization was unstable, try again
                continue;
            remaining.pop_back();
            remaining.push_back(jb);
            info->updates_start++;
            stability_pivots++;
        } else {
            if (fmax_nonfree <= dependency_tol) {
                // jn cannot be pivoted into the basis. If we do not have an
                // unbounded primal ray yet, then test if column jn yields one.
                // Compute the change in the primal objective that is caused by
                // a unit increase of x[jn] with corresponding adjustment of
                // free basic variables.
                if (!info->cols_inconsistent) {
                    const Vector& c = model_.c();
                    double delta_obj = c[jn];
                    auto update_delta_obj = [&](Int p, double f) {
                        Int j = basis_[p];
                        if (std::isinf(colweights[j]))
                            delta_obj -= c[j] * f;
                    };
                    for_each_nonzero(ftran, update_delta_obj);
                    if (std::abs(delta_obj) > dependency_tol) {
                        control_.Debug()
                            << Textline(
                                "Unbounded primal ray with objective change:")
                            << sci2(delta_obj) << '\n';
                        info->cols_inconsistent = true;
                    }
                }
                info->dependent_cols++;
                remaining.pop_back();
            } else {
                Int jb = basis_[pmax_nonfree];
                bool exchanged;
                info->errflag = ExchangeIfStable(jb, jn, ftran[pmax_nonfree],
                                                 -1, &exchanged);
                if (info->errflag)
                    return;
                if (!exchanged)     // factorization was unstable, try again
                    continue;
                remaining.pop_back();
                info->updates_start++;
            }
        }
	std::stringstream h_logging_stream;
	h_logging_stream.str(std::string());
	h_logging_stream << " " << remaining.size() << " free variables remaining\n";
	control_.hIntervalLog(h_logging_stream);
    }
    control_.Debug()
        << Textline("Number of free variables swapped for stability:")
        << stability_pivots << '\n';
}